

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

size_t cookiehash(char *domain)

{
  _Bool _Var1;
  char cVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  
  if (domain == (char *)0x0) {
    return 0;
  }
  _Var1 = Curl_host_is_ipnum(domain);
  if (!_Var1) {
    pcVar3 = (char *)strlen(domain);
    pvVar4 = Curl_memrchr(domain,0x2e,(size_t)pcVar3);
    if ((pvVar4 == (void *)0x0) ||
       (pvVar4 = Curl_memrchr(domain,0x2e,(long)pvVar4 - (long)domain), pvVar4 == (void *)0x0)) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (char *)((long)pvVar4 + 1);
      pcVar3 = domain + ((long)pcVar3 - (long)pcVar5);
    }
    if (pcVar5 != (char *)0x0) {
      domain = pcVar5;
    }
    if ((long)pcVar3 < 1) {
      sVar6 = 0x1a;
    }
    else {
      pcVar3 = domain + (long)pcVar3;
      uVar7 = 0x1505;
      do {
        cVar2 = *domain;
        domain = domain + 1;
        cVar2 = Curl_raw_toupper(cVar2);
        uVar7 = uVar7 * 0x21 ^ (long)cVar2;
      } while (domain < pcVar3);
      sVar6 = uVar7 % 0x3f;
    }
    return sVar6;
  }
  return 0;
}

Assistant:

static size_t cookiehash(const char * const domain)
{
  const char *top;
  size_t len;

  if(!domain || Curl_host_is_ipnum(domain))
    return 0;

  top = get_top_domain(domain, &len);
  return cookie_hash_domain(top, len);
}